

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O0

void __thiscall
cmParseCoberturaCoverage::XMLParser::CharacterDataHandler(XMLParser *this,char *data,int length)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *msg;
  string local_1e8 [32];
  undefined1 local_1c8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_40 [8];
  string tmp;
  int length_local;
  char *data_local;
  XMLParser *this_local;
  
  tmp.field_2._12_4_ = length;
  std::__cxx11::string::string((string *)local_40);
  std::__cxx11::string::insert((ulong)local_40,(char *)0x0,(ulong)data);
  if (((this->InSources & 1U) != 0) && ((this->InSource & 1U) != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->FilePaths,(value_type *)local_40);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar1 = std::operator<<((ostream *)local_1c8,"Adding Source: ");
    poVar1 = std::operator<<(poVar1,(string *)local_40);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_00 = this->CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x2a,msg,(bool)(this->Coverage->Quiet & 1));
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CharacterDataHandler(const char* data, int length) override
  {
    std::string tmp;
    tmp.insert(0, data, length);
    if (this->InSources && this->InSource) {
      this->FilePaths.push_back(tmp);
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Adding Source: " << tmp << std::endl,
                         this->Coverage.Quiet);
    }
  }